

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

Tex * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::Tex>
          (Structure *this,shared_ptr<Assimp::Blender::Tex> *out,size_t *s)

{
  Tex *__p;
  __shared_ptr<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  __p = (Tex *)operator_new(0x440);
  (__p->super_ElemBase).dna_type = (char *)0x0;
  (__p->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__Tex_0080e968;
  (__p->id).super_ElemBase.dna_type = (char *)0x0;
  (__p->id).super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_00807980;
  __p->imaflag = ImageFlags_INTERPOL;
  __p->type = Type_CLOUDS;
  (__p->ima).super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->ima).super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::__shared_ptr<Assimp::Blender::Tex,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::Blender::Tex,void>
            ((__shared_ptr<Assimp::Blender::Tex,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,__p);
  ::std::__shared_ptr<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&out->super___shared_ptr<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2>,&_Stack_28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  *s = 1;
  return (out->super___shared_ptr<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }